

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O1

void intgemm::TestSelectColumnsB<intgemm::AVX2::Kernels8>(Index rows,Index cols)

{
  float *pfVar1;
  result_type_conflict1 rVar2;
  int iVar3;
  size_t __i;
  long lVar4;
  ulong uVar5;
  Index IVar6;
  int c;
  long lVar7;
  float fVar8;
  AlignedVector<float> input;
  AlignedVector<signed_char> ref;
  AlignedVector<signed_char> test;
  AlignedVector<float> selected;
  AlignedVector<signed_char> prepared;
  AssertionHandler catchAssertionHandler;
  uniform_int_distribution<unsigned_int> col_dist;
  Index select_cols [24];
  ScopedMessage scopedMessage17;
  mt19937 gen;
  AlignedVector<float> local_15a0;
  AlignedVector<signed_char> local_1590;
  AlignedVector<signed_char> local_1580;
  AlignedVector<float> local_1570;
  AlignedVector<signed_char> local_1560;
  string local_1550;
  undefined1 local_1530 [8];
  undefined8 local_1528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1520;
  size_type sStack_1510;
  SourceLineInfo *local_1508;
  MessageBuilder local_1500;
  SourceLineInfo local_14a0;
  StringRef local_1490;
  uniform_int_distribution<unsigned_int> local_1480;
  StringRef local_1478;
  Index local_1468 [24];
  ScopedMessage local_1408;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_13b8._M_x[0] = 0x1571;
  lVar4 = 1;
  uVar5 = 0x1571;
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar4);
    local_13b8._M_x[lVar4] = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_13b8._M_p = 0x270;
  AlignedVector<float>::AlignedVector(&local_15a0,(ulong)(cols * rows),0x40);
  pfVar1 = local_15a0.mem_;
  if (local_15a0.size_ != 0) {
    lVar7 = local_15a0.size_ << 2;
    lVar4 = 0;
    do {
      fVar8 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_13b8);
      *(float *)((long)pfVar1 + lVar4) = fVar8 * 258.0 + -129.0;
      lVar4 = lVar4 + 4;
    } while (lVar7 != lVar4);
  }
  AlignedVector<signed_char>::AlignedVector(&local_1560,local_15a0.size_,0x40);
  AVX2::Kernels8::PrepareB(local_15a0.mem_,local_1560.mem_,1.0,rows,cols);
  local_1480._M_param._M_b = cols - 1;
  local_1480._M_param._M_a = 0;
  lVar4 = 0;
  do {
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                      (&local_1480,&local_13b8,&local_1480._M_param);
    *(result_type_conflict1 *)((long)local_1468 + lVar4) = rVar2;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x60);
  uVar5 = (ulong)(rows * 0x18);
  AlignedVector<signed_char>::AlignedVector(&local_1580,uVar5,0x40);
  AVX2::Kernels8::SelectColumnsB
            (local_1560.mem_,local_1580.mem_,rows,local_1468,(Index *)&local_1408);
  AlignedVector<float>::AlignedVector(&local_1570,uVar5,0x40);
  if (rows != 0) {
    iVar3 = 0;
    IVar6 = 0;
    do {
      lVar4 = 0;
      do {
        local_1570.mem_[(uint)(iVar3 + (int)lVar4)] =
             local_15a0.mem_[local_1468[lVar4] + IVar6 * cols];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x18);
      IVar6 = IVar6 + 1;
      iVar3 = iVar3 + 0x18;
    } while (IVar6 != rows);
  }
  AlignedVector<signed_char>::AlignedVector(&local_1590,uVar5,0x40);
  AVX2::Kernels8::PrepareB(local_1570.mem_,local_1590.mem_,1.0,rows,0x18);
  local_1490.m_start = anon_var_dwarf_2352f0 + 9;
  local_1490.m_size = 4;
  local_14a0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/multiply_test.cc";
  local_14a0.line = 0x9b;
  Catch::MessageBuilder::MessageBuilder(&local_1500,&local_1490,&local_14a0,Info);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1500.super_MessageStream.m_stream.m_oss,"Reference:\n",0xb);
  PrintMatrix<signed_char>((string *)local_1530,local_1590.mem_,rows,0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1500.super_MessageStream.m_stream.m_oss,(char *)local_1530,local_1528)
  ;
  PrintMatrix<signed_char>(&local_1550,local_1580.mem_,rows,0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1500.super_MessageStream.m_stream.m_oss,local_1550._M_dataplus._M_p,
             local_1550._M_string_length);
  Catch::ScopedMessage::ScopedMessage(&local_1408,&local_1500);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1550._M_dataplus._M_p != &local_1550.field_2) {
    operator_delete(local_1550._M_dataplus._M_p);
  }
  if (local_1530 != (undefined1  [8])&local_1520) {
    operator_delete((void *)local_1530);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1500.m_info.message._M_dataplus._M_p != &local_1500.m_info.message.field_2) {
    operator_delete(local_1500.m_info.message._M_dataplus._M_p);
  }
  Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_1500);
  local_1530 = (undefined1  [8])0x1b3b11;
  local_1528 = 5;
  local_1550._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/multiply_test.cc";
  local_1550._M_string_length = 0x9b;
  Catch::StringRef::StringRef
            (&local_1478,
             "memcmp(ref.begin(), test.begin(), sizeof(Integer) * rows * kSelectCols) == 0");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1500,(StringRef *)local_1530,(SourceLineInfo *)&local_1550,
             local_1478,ContinueOnFailure);
  iVar3 = memcmp(local_1590.mem_,local_1580.mem_,(ulong)rows * 0x18);
  local_1490.m_start = (char *)CONCAT44(local_1490.m_start._4_4_,iVar3);
  local_14a0.file = (char *)((ulong)local_14a0.file & 0xffffffff00000000);
  Catch::StringRef::StringRef((StringRef *)&local_1550,"==");
  local_1528._0_2_ = CONCAT11(iVar3 == 0,true);
  local_1530 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed958;
  local_1520._8_8_ = local_1550._M_dataplus._M_p;
  sStack_1510 = local_1550._M_string_length;
  local_1520._M_allocated_capacity = (size_type)&local_1490;
  local_1508 = &local_14a0;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&local_1500,(ITransientExpression *)local_1530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1530);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1500);
  if (local_1500.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1500.m_info.message.field_2._8_8_ + 0x70))();
  }
  Catch::ScopedMessage::~ScopedMessage(&local_1408);
  free(local_1590.mem_);
  free(local_1570.mem_);
  free(local_1580.mem_);
  free(local_1560.mem_);
  free(local_15a0.mem_);
  return;
}

Assistant:

void TestSelectColumnsB(Index rows = 64, Index cols = 16) {
  std::mt19937 gen;
  // Go somewhat out of range too.
  std::uniform_real_distribution<float> dist(-129.0, 129.0);
  AlignedVector<float> input(rows * cols);
  for (auto& it : input) {
    it = dist(gen);
  }
  using Integer = typename Routine::Integer;
  AlignedVector<Integer> prepared(input.size());
  Routine::PrepareB(input.begin(), prepared.begin(), 1, rows, cols);

  const int kSelectCols = 24;
  Index select_cols[kSelectCols];
  std::uniform_int_distribution<Index> col_dist(0, cols - 1);
  for (auto& it : select_cols) {
    it = col_dist(gen);
  }

  AlignedVector<Integer> test(rows * kSelectCols);
  Routine::SelectColumnsB(prepared.begin(), test.begin(), rows, select_cols, select_cols + kSelectCols);

  // Select columns manually in float space.
  AlignedVector<float> selected(rows * kSelectCols);
  for (Index r = 0; r < rows; ++r) {
    for (int c = 0; c < kSelectCols; ++c) {
      assert(c + r * kSelectCols < rows * kSelectCols);
      selected[c + r * kSelectCols] = input[select_cols[c] + r * cols];
    }
  }
  AlignedVector<Integer> ref(rows * kSelectCols);
  Routine::PrepareB(selected.begin(), ref.begin(), 1, rows, kSelectCols);
  CHECK_MESSAGE(memcmp(ref.begin(), test.begin(), sizeof(Integer) * rows * kSelectCols) == 0, "Reference:\n" <<
  	PrintMatrix(ref.begin(), rows, kSelectCols) << PrintMatrix(test.begin(), rows, kSelectCols));
}